

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O1

const_iterator __thiscall
Vector::load(Vector *this,void *container_ptr,size_t element_count,InputStream *stream,
            const_iterator begin,const_iterator end)

{
  char cVar1;
  long lVar2;
  long lVar3;
  undefined1 local_40 [8];
  unsigned_long *local_38;
  
  Typelib::Indirect::getIndirection();
  lVar2 = Typelib::Type::getSize();
  resize(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)container_ptr,element_count);
  cVar1 = Typelib::MemoryLayout::isMemcpy();
  if (cVar1 == '\0') {
    if (element_count == 0) {
      local_38 = (unsigned_long *)0x0;
    }
    else {
      lVar3 = 0;
      do {
        Typelib::ValueOps::load
                  (local_40,*container_ptr + lVar3,0,stream,begin._M_current,end._M_current);
        lVar3 = lVar3 + lVar2;
        element_count = element_count - 1;
      } while (element_count != 0);
    }
  }
  else {
    (**(code **)(*(long *)stream + 0x10))(stream,*container_ptr,element_count * begin._M_current[1])
    ;
    local_38 = begin._M_current + 2;
  }
  return (const_iterator)local_38;
}

Assistant:

Container::MarshalOps::const_iterator Vector::load(
        void* container_ptr, size_t element_count,
        InputStream& stream,
        MarshalOps::const_iterator const begin, MarshalOps::const_iterator const end) const
{
    std::vector<uint8_t>* vector_ptr =
        reinterpret_cast< std::vector<uint8_t>* >(container_ptr);

    Type const& element_t = getIndirection();
    size_t      element_size = element_t.getSize();
    resize(vector_ptr, element_count);

    MarshalOps::const_iterator it = begin;
    if (isElementMemcpy())
    {
        size_t size       = *(++it) * element_count;
        stream.read(&(*vector_ptr)[0], size);
        return begin + 2;
    }
    else
    {
        MarshalOps::const_iterator it_end;
        size_t out_offset = 0;
        for (size_t i = 0; i < element_count; ++i)
        {
            boost::tie(out_offset, it_end) =
                ValueOps::load(&(*vector_ptr)[i * element_size], 0,
                    stream, begin, end);
        }
        return it_end;
    }
}